

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::TaskSet::TaskSet(TaskSet *this,ErrorHandler *errorHandler,SourceLocation location)

{
  ErrorHandler *errorHandler_local;
  TaskSet *this_local;
  
  this->errorHandler = errorHandler;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_>::Maybe(&this->tasks);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(&this->emptyFulfiller);
  (this->location).fileName = location.fileName;
  (this->location).function = location.function;
  (this->location).lineNumber = location.lineNumber;
  (this->location).columnNumber = location.columnNumber;
  return;
}

Assistant:

TaskSet::TaskSet(TaskSet::ErrorHandler& errorHandler, SourceLocation location)
  : errorHandler(errorHandler), location(location) {}